

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O2

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::visitFunctionStart
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Function *func)

{
  undefined8 uVar1;
  _Variadic_union<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
  local_e8;
  undefined1 local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8;
  undefined8 local_a0;
  undefined4 local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined1 uStack_58;
  undefined7 uStack_57;
  undefined1 uStack_50;
  undefined8 uStack_4f;
  undefined8 local_40;
  allocator<char> local_31;
  
  if ((this->scopeStack).
      super__Vector_base<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->scopeStack).
      super__Vector_base<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    if (*(__index_type *)
         ((long)&(this->debugLoc).
                 super__Variant_base<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
                 .
                 super__Move_assign_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
                 .
                 super__Copy_assign_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
                 .
                 super__Move_ctor_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
                 .
                 super__Copy_ctor_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
                 .
                 super__Variant_storage_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
         + 0x14) == '\x02') {
      uVar1 = *(undefined8 *)
               ((long)&(this->debugLoc).
                       super__Variant_base<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
                       .
                       super__Move_assign_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
                       .
                       super__Copy_assign_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
                       .
                       super__Move_ctor_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
                       .
                       super__Copy_ctor_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
                       .
                       super__Variant_storage_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
               + 8);
      *(undefined8 *)
       &(func->prologLocation).super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
        _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload =
           *(undefined8 *)
            &(this->debugLoc).
             super__Variant_base<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
             .
             super__Move_assign_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
             .
             super__Copy_assign_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
             .
             super__Move_ctor_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
             .
             super__Copy_ctor_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
             .
             super__Variant_storage_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
      ;
      *(undefined8 *)
       ((long)&(func->prologLocation).
               super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload + 8) = uVar1;
      *(undefined4 *)
       ((long)&(func->prologLocation).
               super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload._M_value.
               symbolNameIndex.super__Optional_base<unsigned_int,_true,_true> + 4) =
           *(undefined4 *)
            ((long)&(this->debugLoc).
                    super__Variant_base<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
                    .
                    super__Move_assign_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
                    .
                    super__Copy_assign_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
                    .
                    super__Move_ctor_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
                    .
                    super__Copy_ctor_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
                    .
                    super__Variant_storage_alias<wasm::IRBuilder::NoDebug,_wasm::IRBuilder::CanReceiveDebug,_wasm::Function::DebugLocation>
            + 0x10);
      if ((func->prologLocation).super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
          _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged == false
         ) {
        (func->prologLocation).super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
        _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged = true;
      }
    }
    std::
    variant<wasm::IRBuilder::NoDebug,wasm::IRBuilder::CanReceiveDebug,wasm::Function::DebugLocation>
    ::operator=((variant<wasm::IRBuilder::NoDebug,wasm::IRBuilder::CanReceiveDebug,wasm::Function::DebugLocation>
                 *)&this->debugLoc,(CanReceiveDebug *)&local_e8);
    local_e8._8_2_ = 0;
    local_d0 = 1;
    local_c8 = 0;
    uStack_c0 = 0;
    local_b8 = 0;
    uStack_b0 = 0;
    local_a8 = 0;
    local_a0 = 0;
    local_98 = 0xffffffff;
    local_40 = 0;
    local_90 = 0;
    uStack_88 = 0;
    local_80 = 0;
    uStack_78 = 0;
    local_70 = 0;
    uStack_68 = 0;
    local_60 = 0;
    uStack_58 = 0;
    uStack_57 = 0;
    uStack_50 = 0;
    uStack_4f = 0;
    local_e8._0_8_ = func;
    std::vector<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>::
    emplace_back<wasm::IRBuilder::ScopeCtx>(&this->scopeStack,(ScopeCtx *)&local_e8);
    ScopeCtx::~ScopeCtx((ScopeCtx *)&local_e8);
    this->func = func;
    if (this->binaryPos != (size_t *)0x0) {
      this->lastBinaryPos = *this->binaryPos;
    }
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"unexpected start of function",&local_31);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::visitFunctionStart(Function* func) {
  if (!scopeStack.empty()) {
    return Err{"unexpected start of function"};
  }
  if (auto* loc = std::get_if<Function::DebugLocation>(&debugLoc)) {
    func->prologLocation = *loc;
  }
  debugLoc = CanReceiveDebug();
  scopeStack.push_back(ScopeCtx::makeFunc(func));
  this->func = func;

  if (binaryPos) {
    lastBinaryPos = *binaryPos;
  }

  return Ok{};
}